

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.h
# Opt level: O1

bool __thiscall ASDCP::MXF::ci_comp::operator()(ci_comp *this,string *a,string *b)

{
  pointer pcVar1;
  uint *puVar2;
  ulong uVar3;
  long *plVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint *local_b0;
  ulong local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  long *local_90;
  ulong local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  uint *local_70;
  ulong local_68;
  undefined8 local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50;
  ulong local_48;
  long local_40;
  undefined8 uStack_38;
  
  pcVar1 = (a->_M_dataplus)._M_p;
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar1,pcVar1 + a->_M_string_length)
  ;
  uVar3 = local_a8;
  puVar2 = local_b0;
  if (local_a8 != 0) {
    uVar8 = 0;
    do {
      iVar5 = tolower((int)*(char *)((long)puVar2 + uVar8));
      *(char *)((long)puVar2 + uVar8) = (char)iVar5;
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  if (local_b0 == &local_a0) {
    uStack_58 = uStack_98;
    uStack_54 = uStack_94;
    local_70 = (uint *)&local_60;
  }
  else {
    local_70 = local_b0;
  }
  local_60 = CONCAT44(uStack_9c,local_a0);
  local_68 = local_a8;
  local_a8 = 0;
  local_a0 = local_a0 & 0xffffff00;
  pcVar1 = (b->_M_dataplus)._M_p;
  local_b0 = &local_a0;
  local_90 = (long *)&local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar1,pcVar1 + b->_M_string_length)
  ;
  uVar3 = local_88;
  plVar4 = local_90;
  if (local_88 != 0) {
    uVar8 = 0;
    do {
      iVar5 = tolower((int)*(char *)((long)plVar4 + uVar8));
      *(char *)((long)plVar4 + uVar8) = (char)iVar5;
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  uVar8 = local_68;
  uVar3 = local_88;
  if (local_90 == (long *)&local_80) {
    uStack_38 = uStack_78;
    local_50 = &local_40;
  }
  else {
    local_50 = local_90;
  }
  local_40 = CONCAT71(uStack_7f,local_80);
  local_48 = local_88;
  local_88 = 0;
  local_80 = 0;
  uVar7 = local_68;
  if (uVar3 < local_68) {
    uVar7 = uVar3;
  }
  if (uVar7 == 0) {
    uVar7 = 0;
    local_90 = (long *)&local_80;
  }
  else {
    local_90 = (long *)&local_80;
    uVar6 = memcmp(local_70,local_50,uVar7);
    uVar7 = (ulong)uVar6;
  }
  if ((int)uVar7 == 0) {
    uVar7 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar8 - uVar3)) {
      uVar7 = uVar8 - uVar3;
    }
    if (0x7ffffffe < (long)uVar7) {
      uVar7 = 0;
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_90 != (long *)&local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_70 != (uint *)&local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT44(uStack_9c,local_a0) + 1);
  }
  return (bool)((byte)(uVar7 >> 0x1f) & 1);
}

Assistant:

inline bool operator()(const std::string& a, const std::string& b) const {
	  return to_lower(a) < to_lower(b);
	}